

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cmn.c
# Opt level: O0

int isobusfs_cmn_configure_socket_filter(int sock,pgn_t pgn)

{
  uint __errnum;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint in_ESI;
  int in_EDI;
  int ret;
  j1939_filter sock_filter [2];
  undefined1 local_58 [16];
  uint local_48;
  undefined4 local_44;
  undefined4 local_28;
  undefined4 local_24;
  uint local_c;
  int local_8;
  uint local_4;
  
  local_c = in_ESI;
  local_8 = in_EDI;
  memset(local_58,0,0x40);
  if ((local_c == 0xaa00) || (local_c == 0xab00)) {
    local_48 = local_c;
    local_44 = 0x3ff00;
    local_28 = 0xe800;
    local_24 = 0x3ff00;
    iVar1 = setsockopt(local_8,0x6b,1,local_58,0x40);
    if (iVar1 < 0) {
      piVar2 = __errno_location();
      __errnum = -*piVar2;
      pcVar3 = strerror(__errnum);
      isobusfs_log(LOG_LEVEL_ERROR,"failed to set j1939 filter: %d (%s)",(ulong)__errnum,pcVar3);
      local_4 = __errnum;
    }
    else {
      local_4 = 0;
    }
  }
  else {
    isobusfs_log(LOG_LEVEL_ERROR,"invalid pgn: %d",(ulong)local_c);
    local_4 = 0xffffffea;
  }
  return local_4;
}

Assistant:

int isobusfs_cmn_configure_socket_filter(int sock, pgn_t pgn)
{
	struct j1939_filter sock_filter[2] = {0};
	int ret;

	if (pgn != ISOBUSFS_PGN_CL_TO_FS && pgn != ISOBUSFS_PGN_FS_TO_CL) {
		pr_err("invalid pgn: %d", pgn);
		return -EINVAL;
	}

	/* Allow ISOBUS FS role specific PGN */
	sock_filter[0].pgn = pgn;
	sock_filter[0].pgn_mask = J1939_PGN_PDU1_MAX;

	/*
	 * ISO 11783-3:2018 - 5.4.5 Acknowledgment.
	 * Allow ACK messages for troubleshooting
	 */
	sock_filter[1].pgn = ISOBUS_PGN_ACK;
	sock_filter[1].pgn_mask = J1939_PGN_PDU1_MAX;

	ret = setsockopt(sock, SOL_CAN_J1939, SO_J1939_FILTER, &sock_filter,
			 sizeof(sock_filter));
	if (ret < 0) {
		ret = -errno;
		pr_err("failed to set j1939 filter: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}